

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

jh_off64_t __thiscall JetHead::File::getLength(File *this)

{
  int iVar1;
  ErrCode EVar2;
  int *piVar3;
  stat64 file_status;
  stat64 sStack_98;
  
  iVar1 = fstat64(this->mFd,&sStack_98);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    EVar2 = getErrorCode(*piVar3);
    this->mError = EVar2;
    sStack_98.st_size = -1;
  }
  return sStack_98.st_size;
}

Assistant:

jh_off64_t	File::getLength() const
{
	jh_stat64_t file_status;

	int res = jh_fstat64( mFd, &file_status );

	if ( res == -1 )
	{
		setError();
		return (jh_off64_t)-1;
	}

	return file_status.st_size;
}